

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_NtkPrintStats(Wlc_Ntk_t *p,int fDistrib,int fTwoSides,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int fVerbose_00;
  long lVar3;
  
  printf("%-20s : ",p->pName);
  uVar1 = Wlc_NtkCountRealPis(p);
  printf("PI = %4d  ",(ulong)uVar1);
  printf("PO = %4d  ",(ulong)(uint)(p->vPos).nSize);
  printf("FF = %4d  ",(ulong)(uint)((p->vCis).nSize - (p->vPis).nSize));
  printf("Obj = %6d  ",(ulong)(uint)(~((p->vCis).nSize + (p->vPos).nSize) + p->iObj));
  iVar2 = Wlc_NtkMemUsage(p);
  printf("Mem = %.3f MB",(double)iVar2 * 9.5367431640625e-07);
  putchar(10);
  if (fDistrib != 0) {
    Wlc_NtkPrintDistrib(p,fTwoSides,fVerbose_00);
    return;
  }
  if (fVerbose != 0) {
    puts("Node type statistics:");
    for (lVar3 = 0; lVar3 != 0x3b; lVar3 = lVar3 + 1) {
      if (p->nObjs[lVar3 + 1] != 0) {
        if ((p->nAnds[0] == 0) || (p->nAnds[lVar3 + 1] == 0)) {
          printf("%2d  :  %-8s  %6d\n",(ulong)((int)lVar3 + 1),Wlc_Names[lVar3 + 1]);
        }
        else {
          printf("%2d  :  %-8s  %6d  %7.2f %%\n",
                 ((double)p->nAnds[lVar3 + 1] * 100.0) / (double)p->nAnds[0],(ulong)((int)lVar3 + 1)
                 ,Wlc_Names[lVar3 + 1]);
        }
      }
    }
  }
  return;
}

Assistant:

void Wlc_NtkPrintStats( Wlc_Ntk_t * p, int fDistrib, int fTwoSides, int fVerbose )
{
    int i;
    printf( "%-20s : ",        p->pName );
    printf( "PI = %4d  ",      Wlc_NtkCountRealPis(p) ); //Wlc_NtkPiNum(p) );
    printf( "PO = %4d  ",      Wlc_NtkPoNum(p) );
    printf( "FF = %4d  ",      Wlc_NtkFfNum(p) );
    printf( "Obj = %6d  ",     Wlc_NtkObjNum(p) - Wlc_NtkPiNum(p) - Wlc_NtkPoNum(p) - Wlc_NtkFfNum(p) );
    printf( "Mem = %.3f MB",   1.0*Wlc_NtkMemUsage(p)/(1<<20) );
    printf( "\n" );
    if ( fDistrib )
    {
        Wlc_NtkPrintDistrib( p, fTwoSides, fVerbose );
        return;
    }
    if ( !fVerbose )
        return;
    printf( "Node type statistics:\n" );
    for ( i = 1; i < WLC_OBJ_NUMBER; i++ )
    {
        if ( !p->nObjs[i] )
            continue;
        if ( p->nAnds[0] && p->nAnds[i] )
            printf( "%2d  :  %-8s  %6d  %7.2f %%\n", i, Wlc_Names[i], p->nObjs[i], 100.0*p->nAnds[i]/p->nAnds[0] );
        else
            printf( "%2d  :  %-8s  %6d\n", i, Wlc_Names[i], p->nObjs[i] );
    }
}